

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall aeron::archive::AeronArchive::AeronArchive(AeronArchive *this,Context *ctx)

{
  unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  *this_00;
  long *plVar1;
  index_t index;
  element_type *peVar2;
  Context *pCVar3;
  ControlResponsePoller *__ptr_00;
  ArchiveProxy *pAVar4;
  AtomicBuffer *this_01;
  _Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false> __ptr_01;
  undefined8 uVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  pointer this_03;
  int32_t iVar7;
  uint uVar8;
  int iVar9;
  int64_t iVar10;
  shared_ptr<aeron::Aeron> *psVar11;
  string *psVar12;
  ControlResponsePoller *this_04;
  ArchiveProxy *this_05;
  _Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false> this_06;
  SourcedException *this_07;
  char *pcVar13;
  pointer __p;
  pointer *__ptr;
  pointer *__ptr_1;
  shared_ptr<aeron::Subscription> subscription;
  shared_ptr<aeron::ExclusivePublication> publication;
  allocator local_c9;
  undefined1 local_c8 [48];
  shared_ptr<aeron::ExclusivePublication> local_98;
  pointer local_80;
  pointer local_78;
  undefined1 local_70 [32];
  string local_50;
  
  Context::Context(&this->ctx_,ctx);
  local_80 = (pointer)&this->archiveProxy_;
  local_78 = (pointer)&this->controlResponsePoller_;
  this_00 = &this->recordingDescriptorPoller_;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->archiveProxy_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ArchiveProxy_*,_std::default_delete<aeron::archive::ArchiveProxy>_>
  .super__Head_base<0UL,_aeron::archive::ArchiveProxy_*,_false>._M_head_impl = (ArchiveProxy *)0x0;
  (this->controlResponsePoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl =
       (ControlResponsePoller *)0x0;
  (this->recordingDescriptorPoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl =
       (RecordingDescriptorPoller *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar10 = Context::messageTimeoutNs(&this->ctx_);
  (this->messageTimeoutNs_).__r = iVar10;
  Context::conclude(&this->ctx_);
  psVar11 = Context::aeron(&this->ctx_);
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psVar11->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(psVar11->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar12 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  iVar7 = Context::controlResponseStreamId(&this->ctx_);
  pCVar3 = peVar2->m_context;
  ClientConductor::addSubscription
            (&peVar2->m_conductor,psVar12,iVar7,&pCVar3->m_onAvailableImageHandler,
             &pCVar3->m_onUnavailableImageHandler);
  local_c8._32_8_ = (__pthread_internal_list *)0x0;
  local_c8._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    ClientConductor::findSubscription
              ((ClientConductor *)local_c8,
               (int64_t)&((this->aeron_).
                          super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         m_conductor);
    uVar5 = local_c8._40_8_;
    local_c8._40_8_ = local_c8._8_8_;
    local_c8._32_8_ = local_c8._0_8_;
    local_c8._0_8_ = (__pthread_internal_list *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5);
    }
    uVar5 = local_c8._32_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    if ((__pthread_internal_list *)uVar5 != (__pthread_internal_list *)0x0) break;
    sched_yield();
  }
  this_04 = (ControlResponsePoller *)operator_new(200);
  this_03 = local_78;
  ControlResponsePoller::ControlResponsePoller
            (this_04,(shared_ptr<aeron::Subscription> *)(local_c8 + 0x20),10);
  local_c8._0_8_ = (element_type *)0x0;
  __ptr_00 = (ControlResponsePoller *)(this_03->m_channel)._M_dataplus._M_p;
  (this_03->m_channel)._M_dataplus._M_p = (pointer)this_04;
  if (__ptr_00 != (ControlResponsePoller *)0x0) {
    std::default_delete<aeron::archive::ControlResponsePoller>::operator()
              ((default_delete<aeron::archive::ControlResponsePoller> *)this_03,__ptr_00);
  }
  if ((element_type *)local_c8._0_8_ != (element_type *)0x0) {
    std::default_delete<aeron::archive::ControlResponsePoller>::operator()
              ((default_delete<aeron::archive::ControlResponsePoller> *)local_c8,
               (ControlResponsePoller *)local_c8._0_8_);
  }
  peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar12 = Context::controlRequestChannel_abi_cxx11_(&this->ctx_);
  iVar7 = Context::controlRequestStreamId(&this->ctx_);
  ClientConductor::addExclusivePublication(&peVar2->m_conductor,psVar12,iVar7);
  local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    ClientConductor::findExclusivePublication
              ((ClientConductor *)local_c8,
               (int64_t)&((this->aeron_).
                          super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         m_conductor);
    this_02._M_pi =
         local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
    local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_c8._0_8_;
    local_c8._0_8_ = (element_type *)0x0;
    local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pointer)this_02._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
    peVar6 = local_98.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
    if (peVar6 != (element_type *)0x0) break;
    sched_yield();
  }
  iVar10 = Context::messageTimeoutNs(&this->ctx_);
  this_05 = (ArchiveProxy *)operator_new(0x1040);
  ArchiveProxy::ArchiveProxy(this_05,&local_98,iVar10,3);
  local_c8._0_8_ = (ArchiveProxy *)0x0;
  pAVar4 = (ArchiveProxy *)(local_80->m_channel)._M_dataplus._M_p;
  (local_80->m_channel)._M_dataplus._M_p = (pointer)this_05;
  if (pAVar4 != (ArchiveProxy *)0x0) {
    std::default_delete<aeron::archive::ArchiveProxy>::operator()
              ((default_delete<aeron::archive::ArchiveProxy> *)local_80,pAVar4);
  }
  if ((ArchiveProxy *)local_c8._0_8_ != (ArchiveProxy *)0x0) {
    std::default_delete<aeron::archive::ArchiveProxy>::operator()
              ((default_delete<aeron::archive::ArchiveProxy> *)local_c8,
               (ArchiveProxy *)local_c8._0_8_);
  }
  peVar2 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (peVar2->m_toDriverRingBuffer).m_buffer;
  index = (peVar2->m_toDriverRingBuffer).m_correlationIdCounterIndex;
  concurrent::AtomicBuffer::boundsCheck(this_01,index,8);
  LOCK();
  plVar1 = (long *)(this_01->m_buffer + index);
  iVar10 = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  pAVar4 = (this->archiveProxy_)._M_t.
           super___uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
           ._M_t.
           super__Tuple_impl<0UL,_aeron::archive::ArchiveProxy_*,_std::default_delete<aeron::archive::ArchiveProxy>_>
           .super__Head_base<0UL,_aeron::archive::ArchiveProxy_*,_false>._M_head_impl;
  psVar12 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  uVar8 = Context::controlResponseStreamId(&this->ctx_);
  iVar9 = ArchiveProxy::connect(pAVar4,(int)psVar12,(sockaddr *)(ulong)uVar8,(socklen_t)iVar10);
  if ((char)iVar9 != '\0') {
    iVar10 = awaitSessionOpened(this,iVar10);
    this->controlSessionId_ = iVar10;
    this_06._M_head_impl = (RecordingDescriptorPoller *)operator_new(0xb8);
    RecordingDescriptorPoller::RecordingDescriptorPoller
              (this_06._M_head_impl,(shared_ptr<aeron::Subscription> *)(local_c8 + 0x20),10,iVar10);
    local_c8._0_8_ = (RecordingDescriptorPoller *)0x0;
    __ptr_01._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
         ._M_t.
         super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
         .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
    ._M_t.
    super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
    .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl =
         this_06._M_head_impl;
    if (__ptr_01._M_head_impl != (RecordingDescriptorPoller *)0x0) {
      std::default_delete<aeron::archive::RecordingDescriptorPoller>::operator()
                ((default_delete<aeron::archive::RecordingDescriptorPoller> *)this_00,
                 __ptr_01._M_head_impl);
    }
    if ((RecordingDescriptorPoller *)local_c8._0_8_ != (RecordingDescriptorPoller *)0x0) {
      std::default_delete<aeron::archive::RecordingDescriptorPoller>::operator()
                ((default_delete<aeron::archive::RecordingDescriptorPoller> *)local_c8,
                 (RecordingDescriptorPoller *)local_c8._0_8_);
    }
    if ((pointer)local_98.
                 super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.
                 super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._40_8_);
    }
    return;
  }
  this_07 = (SourcedException *)__cxa_allocate_exception(0x48);
  psVar12 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 "cannot connect to archive: ",psVar12);
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"aeron::archive::AeronArchive::AeronArchive(const Context &)","");
  pcVar13 = aeron::util::past_prefix
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                      );
  std::__cxx11::string::string((string *)&local_50,pcVar13,&local_c9);
  aeron::util::SourcedException::SourcedException
            (this_07,(string *)local_c8,(string *)local_70,&local_50,0x40);
  *(undefined ***)this_07 = &PTR__SourcedException_00162228;
  __cxa_throw(this_07,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx)
    : ctx_(ctx)
    , messageTimeoutNs_(ctx_.messageTimeoutNs()) {
    ctx_.conclude();

    aeron_ = ctx_.aeron();
    // aeronClientInvoker_ = aeron_->conductorAgentInvoker();
    // TODO: get it from the context: idleStrategy_ = ...

    std::int64_t subId = aeron_->addSubscription(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId());
    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    controlResponsePoller_ = std::make_unique<ControlResponsePoller>(subscription, FRAGMENT_LIMIT);

    std::int64_t pubId = aeron_->addExclusivePublication(ctx_.controlRequestChannel(), ctx_.controlRequestStreamId());
    std::shared_ptr<ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    archiveProxy_ = std::make_unique<ArchiveProxy>(publication, ctx_.messageTimeoutNs(), DEFAULT_RETRY_ATTEMPTS);

    std::int64_t correlationId = aeron_->nextCorrelationId();
    if (!archiveProxy_->connect(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId(), correlationId,
                                aeron_->conductorAgentInvoker())) {
        throw ArchiveException("cannot connect to archive: " + ctx_.controlResponseChannel(), SOURCEINFO);
    }

    controlSessionId_ = awaitSessionOpened(correlationId);
    recordingDescriptorPoller_ =
        std::make_unique<RecordingDescriptorPoller>(subscription, FRAGMENT_LIMIT, controlSessionId_);
}